

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

void __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::AddError(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,GValue *keyword,GValue *error)

{
  MemberIterator member;
  GValue errors;
  undefined1 local_50 [16];
  undefined8 uStack_40;
  
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::FindMember<rapidjson::CrtAllocator>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)local_50,&this->error_)
  ;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_50 + 8));
  if (local_50._0_8_ == local_50._8_8_) {
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::AddMember
              (&this->error_,keyword,error,this->allocator_);
  }
  else {
    if (*(short *)(local_50._0_8_ + 0x1e) == 3) {
      local_50._8_8_ = (Ch *)0x0;
      uStack_40 = 0x4000000000000;
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_50 + 8),
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                 (local_50._0_8_ + 0x10),this->allocator_);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator=
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                 (local_50._0_8_ + 0x10),
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_50 + 8));
      GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)(local_50 + 8));
    }
    GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::PushBack
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
               (local_50._0_8_ + 0x10),error,this->allocator_);
  }
  return;
}

Assistant:

void AddError(GValue& keyword, GValue& error) {
      typename GValue::MemberIterator member = error_.FindMember(keyword);
      if (member == error_.MemberEnd())
        error_.AddMember(keyword, error, *allocator_);
      else {
        if (member->value.IsObject()) {
          GValue errors(kArrayType);
          errors.PushBack(member->value, *allocator_);
          member->value = errors;
        }
        member->value.PushBack(error, *allocator_);
      }
    }